

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_symbolValueBinding_createWithFlags
          (sysbvm_context_t *context,sysbvm_tuple_t sourcePosition,sysbvm_tuple_t name,
          sysbvm_tuple_t value,_Bool isMutable,_Bool isExternal,_Bool isThreadLocal)

{
  sysbvm_object_tuple_t *psVar1;
  anon_union_8_3_721b4b48_for_sysbvm_tuple_header_s_0 aVar2;
  ulong uVar3;
  
  psVar1 = sysbvm_context_allocatePointerTuple(context,(context->roots).symbolValueBindingType,0xb);
  (psVar1->field_1).pointers[0] = name;
  psVar1[1].field_1.pointers[0] = sourcePosition;
  uVar3 = value & 0xf;
  if (uVar3 == 0 && value != 0) {
    aVar2.typePointer = *value;
  }
  else if ((int)uVar3 == 0xf) {
    aVar2.typePointer = sysbvm_tuple_getImmediateTrivialTypeWithIndex(context,value >> 4);
  }
  else {
    aVar2.typePointer = sysbvm_tuple_getImmediateTypeWithTag(context,uVar3);
  }
  psVar1[2].header.field_0 = aVar2;
  psVar1[2].header.identityHashAndFlags = (int)value;
  psVar1[2].header.objectSize = (int)(value >> 0x20);
  psVar1[2].field_1.pointers[0] = (ulong)isMutable << 4 | 0xf;
  psVar1[3].header.field_0.typePointer = (ulong)isExternal << 4 | 0xf;
  uVar3 = (ulong)isThreadLocal << 4 | 0xf;
  psVar1[3].header.identityHashAndFlags = (int)uVar3;
  psVar1[3].header.objectSize = (int)(uVar3 >> 0x20);
  psVar1[4].header.field_0.typePointer = 0xb;
  return (sysbvm_tuple_t)psVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_symbolValueBinding_createWithFlags(sysbvm_context_t *context, sysbvm_tuple_t sourcePosition, sysbvm_tuple_t name, sysbvm_tuple_t value, bool isMutable, bool isExternal, bool isThreadLocal)
{
    sysbvm_symbolValueBinding_t *result = (sysbvm_symbolValueBinding_t*)sysbvm_context_allocatePointerTuple(context, context->roots.symbolValueBindingType, SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_symbolValueBinding_t));
    result->super.super.name = name;
    result->super.sourcePosition = sourcePosition;
    result->super.type = sysbvm_tuple_getType(context, value);
    result->value = value;
    result->isMutable = sysbvm_tuple_boolean_encode(isMutable);
    result->isExternal = sysbvm_tuple_boolean_encode(isExternal);
    result->isThreadLocal = sysbvm_tuple_boolean_encode(isThreadLocal);
    result->virtualAddress = sysbvm_tuple_uintptr_encode(context, 0);
    return (sysbvm_tuple_t)result;
}